

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginDisabledOverrideReenable(void)

{
  byte *pbVar1;
  int iVar2;
  int *__src;
  ImGuiContext *pIVar3;
  int *__dest;
  int iVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  (GImGui->Style).Alpha = GImGui->DisabledAlphaBackup;
  pbVar1 = (byte *)((long)&pIVar3->CurrentItemFlags + 1);
  *pbVar1 = *pbVar1 & 0xfb;
  iVar5 = (pIVar3->ItemFlagsStack).Size;
  iVar2 = (pIVar3->ItemFlagsStack).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      __dest = (int *)MemAlloc((long)iVar5 << 2);
      __src = (pIVar3->ItemFlagsStack).Data;
      if (__src != (int *)0x0) {
        memcpy(__dest,__src,(long)(pIVar3->ItemFlagsStack).Size << 2);
        MemFree((pIVar3->ItemFlagsStack).Data);
      }
      (pIVar3->ItemFlagsStack).Data = __dest;
      (pIVar3->ItemFlagsStack).Capacity = iVar5;
    }
  }
  (pIVar3->ItemFlagsStack).Data[(pIVar3->ItemFlagsStack).Size] = pIVar3->CurrentItemFlags;
  (pIVar3->ItemFlagsStack).Size = (pIVar3->ItemFlagsStack).Size + 1;
  pIVar3->DisabledStackSize = pIVar3->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabledOverrideReenable()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentItemFlags & ImGuiItemFlags_Disabled);
    g.Style.Alpha = g.DisabledAlphaBackup;
    g.CurrentItemFlags &= ~ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}